

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3243::Calc_Sxi_D
          (ChElementBeamANCF_3243 *this,MatrixNx3c *Sxi_D,double xi,double eta,double zeta)

{
  VectorN Sxi_D_col;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true> local_f0;
  VectorN local_c0 [2];
  
  Calc_Sxi_xi_compact(this,local_c0,xi,eta,zeta);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>::
  BlockImpl_dense(&local_f0,Sxi_D,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>,Eigen::Matrix<double,8,1,0,8,1>>
            ((Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true> *)&local_f0,local_c0);
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6]
       = this->m_thicknessY * 0.25;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2]
       = (1.0 - xi) *
         local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
         array[6];
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6]
       = (xi + 1.0) *
         local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
         array[6];
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4]
       = 0.0;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5]
       = 0.0;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7]
       = 0.0;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>::
  BlockImpl_dense(&local_f0,Sxi_D,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>,Eigen::Matrix<double,8,1,0,8,1>>
            ((Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true> *)&local_f0,local_c0);
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7]
       = this->m_thicknessZ * 0.25;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3]
       = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
         array[7] * (1.0 - xi);
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7]
       = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
         array[7] * (xi + 1.0);
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6]
       = 0.0;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4]
       = 0.0;
  local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5]
       = 0.0;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>::
  BlockImpl_dense(&local_f0,Sxi_D,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>,Eigen::Matrix<double,8,1,0,8,1>>
            ((Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true> *)&local_f0,local_c0);
  return;
}

Assistant:

void ChElementBeamANCF_3243::Calc_Sxi_D(MatrixNx3c& Sxi_D, double xi, double eta, double zeta) {
    VectorN Sxi_D_col;
    Calc_Sxi_xi_compact(Sxi_D_col, xi, eta, zeta);
    Sxi_D.col(0) = Sxi_D_col;

    Calc_Sxi_eta_compact(Sxi_D_col, xi, eta, zeta);
    Sxi_D.col(1) = Sxi_D_col;

    Calc_Sxi_zeta_compact(Sxi_D_col, xi, eta, zeta);
    Sxi_D.col(2) = Sxi_D_col;
}